

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void * __thiscall
google::protobuf::internal::ExtensionSet::MutableRawRepeatedField
          (ExtensionSet *this,int number,FieldType field_type,bool packed,FieldDescriptor *desc)

{
  bool bVar1;
  CppType CVar2;
  LogMessage *pLVar3;
  anon_union_8_9_fdc4a54a_for_Extension_0 aVar4;
  LogMessage local_40;
  Voidify local_29;
  Extension *local_28;
  Extension *extension;
  FieldDescriptor *desc_local;
  bool packed_local;
  FieldType field_type_local;
  ExtensionSet *pEStack_10;
  int number_local;
  ExtensionSet *this_local;
  
  extension = (Extension *)desc;
  desc_local._2_1_ = packed;
  desc_local._3_1_ = field_type;
  desc_local._4_4_ = number;
  pEStack_10 = this;
  bVar1 = MaybeNewExtension(this,number,desc,&local_28);
  if (bVar1) {
    local_28->is_repeated = true;
    local_28->field_0xa = local_28->field_0xa & 0xfe | 1;
    local_28->type = desc_local._3_1_;
    local_28->is_packed = (bool)(desc_local._2_1_ & 1);
    if (((byte)local_28->field_0xa >> 1 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x196,"!extension->is_cleared");
      pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar3);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_40);
    }
    CVar2 = WireFormatLite::FieldTypeToCppType((uint)desc_local._3_1_);
    switch(CVar2) {
    case CPPTYPE_INT32:
      aVar4 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::Create<google::protobuf::RepeatedField<int>>(this->arena_);
      local_28->field_0 = aVar4;
      break;
    case CPPTYPE_INT64:
      aVar4 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::Create<google::protobuf::RepeatedField<long>>(this->arena_);
      local_28->field_0 = aVar4;
      break;
    case CPPTYPE_UINT32:
      aVar4 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::Create<google::protobuf::RepeatedField<unsigned_int>>(this->arena_);
      local_28->field_0 = aVar4;
      break;
    case CPPTYPE_UINT64:
      aVar4 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::Create<google::protobuf::RepeatedField<unsigned_long>>(this->arena_);
      local_28->field_0 = aVar4;
      break;
    case CPPTYPE_DOUBLE:
      aVar4 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::Create<google::protobuf::RepeatedField<double>>(this->arena_);
      local_28->field_0 = aVar4;
      break;
    case CPPTYPE_FLOAT:
      aVar4 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::Create<google::protobuf::RepeatedField<float>>(this->arena_);
      local_28->field_0 = aVar4;
      break;
    case CPPTYPE_BOOL:
      aVar4 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::Create<google::protobuf::RepeatedField<bool>>(this->arena_);
      local_28->field_0 = aVar4;
      break;
    case CPPTYPE_ENUM:
      aVar4 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::Create<google::protobuf::RepeatedField<int>>(this->arena_);
      local_28->field_0 = aVar4;
      break;
    case CPPTYPE_STRING:
      aVar4 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::Create<google::protobuf::RepeatedPtrField<std::__cxx11::string>>(this->arena_);
      local_28->field_0 = aVar4;
      break;
    case CPPTYPE_MESSAGE:
      aVar4 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::Create<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>
                        (this->arena_);
      local_28->field_0 = aVar4;
    }
  }
  return (void *)(local_28->field_0).int64_t_value;
}

Assistant:

void* ExtensionSet::MutableRawRepeatedField(int number, FieldType field_type,
                                            bool packed,
                                            const FieldDescriptor* desc) {
  Extension* extension;

  // We instantiate an empty Repeated{,Ptr}Field if one doesn't exist for this
  // extension.
  if (MaybeNewExtension(number, desc, &extension)) {
    extension->is_repeated = true;
    extension->is_pointer = true;
    extension->type = field_type;
    extension->is_packed = packed;
    ABSL_DCHECK(!extension->is_cleared);

    switch (WireFormatLite::FieldTypeToCppType(
        static_cast<WireFormatLite::FieldType>(field_type))) {
      case WireFormatLite::CPPTYPE_INT32:
        extension->ptr.repeated_int32_t_value =
            Arena::Create<RepeatedField<int32_t>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_INT64:
        extension->ptr.repeated_int64_t_value =
            Arena::Create<RepeatedField<int64_t>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_UINT32:
        extension->ptr.repeated_uint32_t_value =
            Arena::Create<RepeatedField<uint32_t>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_UINT64:
        extension->ptr.repeated_uint64_t_value =
            Arena::Create<RepeatedField<uint64_t>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_DOUBLE:
        extension->ptr.repeated_double_value =
            Arena::Create<RepeatedField<double>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_FLOAT:
        extension->ptr.repeated_float_value =
            Arena::Create<RepeatedField<float>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_BOOL:
        extension->ptr.repeated_bool_value =
            Arena::Create<RepeatedField<bool>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_ENUM:
        extension->ptr.repeated_enum_value =
            Arena::Create<RepeatedField<int>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_STRING:
        extension->ptr.repeated_string_value =
            Arena::Create<RepeatedPtrField<std::string>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_MESSAGE:
        extension->ptr.repeated_message_value =
            Arena::Create<RepeatedPtrField<MessageLite>>(arena_);
        break;
    }
  }

  // We assume that all the RepeatedField<>* pointers have the same
  // size and alignment within the anonymous union in Extension.
  return extension->ptr.repeated_int32_t_value;
}